

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O0

void __thiscall Block<float>::verify_block(Block<float> *this,ProxyWithLink *cp)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  ostream *poVar4;
  Proxy *in_RSI;
  float *in_RDI;
  size_t i;
  size_type local_20;
  ulong local_18;
  Proxy *local_10;
  
  local_18 = 0;
  local_10 = in_RSI;
  do {
    uVar1 = local_18;
    sVar2 = std::vector<float,_std::allocator<float>_>::size
                      ((vector<float,_std::allocator<float>_> *)(in_RDI + 2));
    if (sVar2 <= uVar1) {
      local_20 = std::vector<float,_std::allocator<float>_>::size
                           ((vector<float,_std::allocator<float>_> *)(in_RDI + 2));
      diy::Master::Proxy::all_reduce<unsigned_long,std::plus<unsigned_long>>(local_10,&local_20);
      return;
    }
    pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)(in_RDI + 2),local_18);
    if (*pvVar3 < *in_RDI) {
LAB_00117d6b:
      poVar4 = std::operator<<((ostream *)&std::cout,"Warning: ");
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 2),local_18);
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*pvVar3);
      poVar4 = std::operator<<(poVar4," outside of [");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,*in_RDI);
      poVar4 = std::operator<<(poVar4,",");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,in_RDI[1]);
      poVar4 = std::operator<<(poVar4,"]");
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
    else {
      pvVar3 = std::vector<float,_std::allocator<float>_>::operator[]
                         ((vector<float,_std::allocator<float>_> *)(in_RDI + 2),local_18);
      if (in_RDI[1] <= *pvVar3 && *pvVar3 != in_RDI[1]) goto LAB_00117d6b;
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

void          verify_block(const diy::Master::ProxyWithLink& cp)
  {
    for (size_t i = 0; i < values.size(); ++i)
      if (values[i] < min || values[i] > max)
        std::cout << "Warning: " << values[i] << " outside of [" << min << "," << max << "]" << std::endl;

    cp.all_reduce(values.size(), std::plus<size_t>());
  }